

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall helics::Publication::publish(Publication *this,bool val)

{
  string_view val_00;
  char *pcVar1;
  bool bVar2;
  byte in_SIL;
  data_view *in_RDI;
  SmallBuffer db;
  DataType in_stack_000000fc;
  string_view in_stack_00000100;
  string_view bstring;
  bool doPublish;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  SmallBuffer *this_00;
  char *in_stack_fffffffffffffee8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffef0;
  SmallBuffer *dt;
  Publication *in_stack_ffffffffffffff08;
  ValueFederate *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  allocator<char> local_51 [33];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_RDI[1].ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_9 == 0) {
    pcVar1 = "+0";
  }
  else {
    pcVar1 = "*1";
  }
  dt = (SmallBuffer *)(pcVar1 + 1);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (((ulong)in_RDI[2].ref.
              super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi & 0x100000000) != 0) {
    local_30 = local_20;
    local_28 = uStack_18;
    val_00._M_str = (char *)in_stack_ffffffffffffff08;
    val_00._M_len = (size_t)in_RDI;
    bVar2 = changeDetected((defV *)dt,val_00,(double)in_stack_fffffffffffffef0);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (allocator<char> *)in_stack_ffffffffffffff10);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dt)
      ;
      std::__cxx11::string::~string(in_stack_fffffffffffffee0);
      std::allocator<char>::~allocator(local_51);
    }
    else {
      local_a = 0;
    }
  }
  if ((local_a & 1) != 0) {
    typeConvert(in_stack_000000fc,(string_view)in_stack_00000100);
    this_00 = (SmallBuffer *)
              in_RDI[1].ref.
              super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    data_view::data_view(in_RDI,dt);
    helics::ValueFederate::publishBytes(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_RDI);
    data_view::~data_view((data_view *)0x3ac80b);
    SmallBuffer::~SmallBuffer(this_00);
  }
  return;
}

Assistant:

void Publication::publish(bool val)
{
    bool doPublish = (fed != nullptr);
    std::string_view bstring = val ? "1" : "0";
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, bstring, delta)) {
            prevValue = std::string(bstring);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, bstring);
        fed->publishBytes(*this, db);
    }
}